

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

curl_slist * Curl_cookie_list(SessionHandle *data)

{
  curl_slist *list;
  char *data_00;
  curl_slist *pcVar1;
  Cookie *co;
  
  co = (Cookie *)data->cookies;
  if ((co != (Cookie *)0x0) && (co->path != (char *)0x0)) {
    pcVar1 = (curl_slist *)0x0;
    do {
      list = pcVar1;
      co = co->next;
      if (co == (Cookie *)0x0) {
        return list;
      }
      data_00 = get_netscape_format(co);
      if (data_00 == (char *)0x0) goto LAB_00475188;
      pcVar1 = Curl_slist_append_nodup(list,data_00);
    } while (pcVar1 != (curl_slist *)0x0);
    (*Curl_cfree)(data_00);
LAB_00475188:
    curl_slist_free_all(list);
  }
  return (curl_slist *)0x0;
}

Assistant:

struct curl_slist *Curl_cookie_list(struct SessionHandle *data)
{
  struct curl_slist *list = NULL;
  struct curl_slist *beg;
  struct Cookie *c;
  char *line;

  if((data->cookies == NULL) ||
      (data->cookies->numcookies == 0))
    return NULL;

  c = data->cookies->cookies;

  while(c) {
    /* fill the list with _all_ the cookies we know */
    line = get_netscape_format(c);
    if(!line) {
      curl_slist_free_all(list);
      return NULL;
    }
    beg = Curl_slist_append_nodup(list, line);
    if(!beg) {
      free(line);
      curl_slist_free_all(list);
      return NULL;
    }
    list = beg;
    c = c->next;
  }

  return list;
}